

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coreaction.cc
# Opt level: O1

void universal_action(Architecture *conf)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  AddrSpace *pAVar2;
  pointer ppRVar3;
  Architecture *pAVar4;
  ActionGroup *this;
  Action *pAVar5;
  ActionExtraPopSetup *this_00;
  ActionGroup *pAVar6;
  ActionGroup *this_01;
  ActionSegmentize *this_02;
  ActionDirectWrite *pAVar7;
  ActionRestructureVarnode *this_03;
  ActionInferTypes *this_04;
  ActionPool *pAVar8;
  Rule *pRVar9;
  RulePtrFlow *this_05;
  RuleSubvarSext *this_06;
  ActionStackPtrFlow *this_07;
  ActionConstantPtr *this_08;
  pointer ppRVar10;
  string local_68;
  Architecture *local_48;
  ActionGroup *local_40;
  AddrSpace *local_38;
  
  pAVar2 = (conf->super_AddrSpaceManager).stackspace;
  build_defaultactions(&conf->allacts);
  this = (ActionGroup *)operator_new(0x90);
  paVar1 = &local_68.field_2;
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"universal","");
  ActionGroup::ActionGroup(this,8,&local_68);
  (this->super_Action)._vptr_Action = (_func_int **)&PTR__ActionGroup_003c2a60;
  *(undefined4 *)&this[1].super_Action._vptr_Action = 1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  local_48 = conf;
  ActionDatabase::registerUniversal(&conf->allacts,(Action *)this);
  pAVar5 = (Action *)operator_new(0x68);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"base","");
  ActionStart::ActionStart((ActionStart *)pAVar5,&local_68);
  ActionGroup::addAction(this,pAVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pAVar5 = (Action *)operator_new(0x68);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"base","");
  ActionConstbase::ActionConstbase((ActionConstbase *)pAVar5,&local_68);
  ActionGroup::addAction(this,pAVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pAVar5 = (Action *)operator_new(0x68);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"normalanalysis","");
  ActionNormalizeSetup::ActionNormalizeSetup((ActionNormalizeSetup *)pAVar5,&local_68);
  ActionGroup::addAction(this,pAVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pAVar5 = (Action *)operator_new(0x68);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"base","");
  ActionDefaultParams::ActionDefaultParams((ActionDefaultParams *)pAVar5,&local_68);
  ActionGroup::addAction(this,pAVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  this_00 = (ActionExtraPopSetup *)operator_new(0x70);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"base","");
  ActionExtraPopSetup::ActionExtraPopSetup(this_00,&local_68,pAVar2);
  ActionGroup::addAction(this,(Action *)this_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pAVar5 = (Action *)operator_new(0x68);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"protorecovery","");
  ActionPrototypeTypes::ActionPrototypeTypes((ActionPrototypeTypes *)pAVar5,&local_68);
  ActionGroup::addAction(this,pAVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pAVar5 = (Action *)operator_new(0x68);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"protorecovery","");
  ActionFuncLink::ActionFuncLink((ActionFuncLink *)pAVar5,&local_68);
  ActionGroup::addAction(this,pAVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pAVar5 = (Action *)operator_new(0x68);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"noproto","");
  ActionFuncLinkOutOnly::ActionFuncLinkOutOnly((ActionFuncLinkOutOnly *)pAVar5,&local_68);
  ActionGroup::addAction(this,pAVar5);
  local_38 = pAVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pAVar6 = (ActionGroup *)operator_new(0x88);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"fullloop","");
  ActionGroup::ActionGroup(pAVar6,4,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  this_01 = (ActionGroup *)operator_new(0x88);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"mainloop","");
  ActionGroup::ActionGroup(this_01,4,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pAVar5 = (Action *)operator_new(0x68);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"base","");
  ActionUnreachable::ActionUnreachable((ActionUnreachable *)pAVar5,&local_68);
  ActionGroup::addAction(this_01,pAVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pAVar5 = (Action *)operator_new(0x68);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"base","");
  ActionVarnodeProps::ActionVarnodeProps((ActionVarnodeProps *)pAVar5,&local_68);
  ActionGroup::addAction(this_01,pAVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pAVar5 = (Action *)operator_new(0x68);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"base","");
  ActionHeritage::ActionHeritage((ActionHeritage *)pAVar5,&local_68);
  ActionGroup::addAction(this_01,pAVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pAVar5 = (Action *)operator_new(0x68);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"protorecovery","");
  ActionParamDouble::ActionParamDouble((ActionParamDouble *)pAVar5,&local_68);
  ActionGroup::addAction(this_01,pAVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  this_02 = (ActionSegmentize *)operator_new(0x70);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"base","");
  ActionSegmentize::ActionSegmentize(this_02,&local_68);
  ActionGroup::addAction(this_01,(Action *)this_02);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pAVar5 = (Action *)operator_new(0x68);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"blockrecovery","");
  ActionForceGoto::ActionForceGoto((ActionForceGoto *)pAVar5,&local_68);
  ActionGroup::addAction(this_01,pAVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  local_40 = pAVar6;
  pAVar7 = (ActionDirectWrite *)operator_new(0x70);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"protorecovery_a","");
  ActionDirectWrite::ActionDirectWrite(pAVar7,&local_68,true);
  ActionGroup::addAction(this_01,(Action *)pAVar7);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pAVar7 = (ActionDirectWrite *)operator_new(0x70);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"protorecovery_b","");
  ActionDirectWrite::ActionDirectWrite(pAVar7,&local_68,false);
  ActionGroup::addAction(this_01,(Action *)pAVar7);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pAVar5 = (Action *)operator_new(0x68);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"protorecovery","");
  ActionActiveParam::ActionActiveParam((ActionActiveParam *)pAVar5,&local_68);
  ActionGroup::addAction(this_01,pAVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pAVar5 = (Action *)operator_new(0x68);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"protorecovery","");
  ActionReturnRecovery::ActionReturnRecovery((ActionReturnRecovery *)pAVar5,&local_68);
  ActionGroup::addAction(this_01,pAVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pAVar5 = (Action *)operator_new(0x68);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"localrecovery","");
  ActionRestrictLocal::ActionRestrictLocal((ActionRestrictLocal *)pAVar5,&local_68);
  ActionGroup::addAction(this_01,pAVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pAVar5 = (Action *)operator_new(0x68);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"deadcode","");
  ActionDeadCode::ActionDeadCode((ActionDeadCode *)pAVar5,&local_68);
  ActionGroup::addAction(this_01,pAVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pAVar5 = (Action *)operator_new(0x68);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"dynamic","");
  ActionDynamicMapping::ActionDynamicMapping((ActionDynamicMapping *)pAVar5,&local_68);
  ActionGroup::addAction(this_01,pAVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  this_03 = (ActionRestructureVarnode *)operator_new(0x70);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"localrecovery","");
  ActionRestructureVarnode::ActionRestructureVarnode(this_03,&local_68);
  ActionGroup::addAction(this_01,(Action *)this_03);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pAVar5 = (Action *)operator_new(0x68);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"base","");
  ActionSpacebase::ActionSpacebase((ActionSpacebase *)pAVar5,&local_68);
  ActionGroup::addAction(this_01,pAVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pAVar5 = (Action *)operator_new(0x68);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  ActionNonzeroMask::ActionNonzeroMask((ActionNonzeroMask *)pAVar5,&local_68);
  ActionGroup::addAction(this_01,pAVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  this_04 = (ActionInferTypes *)operator_new(0x70);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"typerecovery","");
  ActionInferTypes::ActionInferTypes(this_04,&local_68);
  ActionGroup::addAction(this_01,(Action *)this_04);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pAVar6 = (ActionGroup *)operator_new(0x88);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"stackstall","");
  ActionGroup::ActionGroup(pAVar6,4,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pAVar8 = (ActionPool *)operator_new(0x768);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"oppool1","");
  ActionPool::ActionPool(pAVar8,4,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"deadcode","");
  RuleEarlyRemoval::RuleEarlyRemoval((RuleEarlyRemoval *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RuleTermOrder::RuleTermOrder((RuleTermOrder *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RuleSelectCse::RuleSelectCse((RuleSelectCse *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RuleCollectTerms::RuleCollectTerms((RuleCollectTerms *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RulePullsubMulti::RulePullsubMulti((RulePullsubMulti *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RulePullsubIndirect::RulePullsubIndirect((RulePullsubIndirect *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"nodejoin","");
  RulePushMulti::RulePushMulti((RulePushMulti *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RuleSborrow::RuleSborrow((RuleSborrow *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RuleIntLessEqual::RuleIntLessEqual((RuleIntLessEqual *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RuleTrivialArith::RuleTrivialArith((RuleTrivialArith *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RuleTrivialBool::RuleTrivialBool((RuleTrivialBool *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RuleTrivialShift::RuleTrivialShift((RuleTrivialShift *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RuleSignShift::RuleSignShift((RuleSignShift *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RuleTestSign::RuleTestSign((RuleTestSign *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RuleIdentityEl::RuleIdentityEl((RuleIdentityEl *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RuleOrMask::RuleOrMask((RuleOrMask *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RuleAndMask::RuleAndMask((RuleAndMask *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RuleOrConsume::RuleOrConsume((RuleOrConsume *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RuleOrCollapse::RuleOrCollapse((RuleOrCollapse *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RuleAndOrLump::RuleAndOrLump((RuleAndOrLump *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RuleShiftBitops::RuleShiftBitops((RuleShiftBitops *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RuleRightShiftAnd::RuleRightShiftAnd((RuleRightShiftAnd *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RuleNotDistribute::RuleNotDistribute((RuleNotDistribute *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RuleHighOrderAnd::RuleHighOrderAnd((RuleHighOrderAnd *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RuleAndDistribute::RuleAndDistribute((RuleAndDistribute *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RuleAndCommute::RuleAndCommute((RuleAndCommute *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RuleAndPiece::RuleAndPiece((RuleAndPiece *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RuleAndCompare::RuleAndCompare((RuleAndCompare *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RuleDoubleSub::RuleDoubleSub((RuleDoubleSub *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RuleDoubleShift::RuleDoubleShift((RuleDoubleShift *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RuleDoubleArithShift::RuleDoubleArithShift((RuleDoubleArithShift *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RuleConcatShift::RuleConcatShift((RuleConcatShift *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RuleLeftRight::RuleLeftRight((RuleLeftRight *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RuleShiftCompare::RuleShiftCompare((RuleShiftCompare *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RuleShift2Mult::RuleShift2Mult((RuleShift2Mult *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RuleShiftPiece::RuleShiftPiece((RuleShiftPiece *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RuleMultiCollapse::RuleMultiCollapse((RuleMultiCollapse *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RuleIndirectCollapse::RuleIndirectCollapse((RuleIndirectCollapse *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  Rule2Comp2Mult::Rule2Comp2Mult((Rule2Comp2Mult *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RuleSub2Add::RuleSub2Add((RuleSub2Add *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RuleCarryElim::RuleCarryElim((RuleCarryElim *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RuleBxor2NotEqual::RuleBxor2NotEqual((RuleBxor2NotEqual *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RuleLess2Zero::RuleLess2Zero((RuleLess2Zero *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RuleLessEqual2Zero::RuleLessEqual2Zero((RuleLessEqual2Zero *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RuleSLess2Zero::RuleSLess2Zero((RuleSLess2Zero *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RuleEqual2Zero::RuleEqual2Zero((RuleEqual2Zero *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RuleEqual2Constant::RuleEqual2Constant((RuleEqual2Constant *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RuleThreeWayCompare::RuleThreeWayCompare((RuleThreeWayCompare *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RuleXorCollapse::RuleXorCollapse((RuleXorCollapse *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RuleAddMultCollapse::RuleAddMultCollapse((RuleAddMultCollapse *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RuleCollapseConstants::RuleCollapseConstants((RuleCollapseConstants *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RuleTransformCpool::RuleTransformCpool((RuleTransformCpool *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RulePropagateCopy::RulePropagateCopy((RulePropagateCopy *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RuleZextEliminate::RuleZextEliminate((RuleZextEliminate *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RuleSlessToLess::RuleSlessToLess((RuleSlessToLess *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RuleZextSless::RuleZextSless((RuleZextSless *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RuleBitUndistribute::RuleBitUndistribute((RuleBitUndistribute *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RuleBoolZext::RuleBoolZext((RuleBoolZext *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RuleBooleanNegate::RuleBooleanNegate((RuleBooleanNegate *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RuleLogic2Bool::RuleLogic2Bool((RuleLogic2Bool *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RuleSubExtComm::RuleSubExtComm((RuleSubExtComm *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RuleSubCommute::RuleSubCommute((RuleSubCommute *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RuleConcatCommute::RuleConcatCommute((RuleConcatCommute *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RuleConcatZext::RuleConcatZext((RuleConcatZext *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RuleZextCommute::RuleZextCommute((RuleZextCommute *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RuleZextShiftZext::RuleZextShiftZext((RuleZextShiftZext *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RuleShiftAnd::RuleShiftAnd((RuleShiftAnd *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RuleConcatZero::RuleConcatZero((RuleConcatZero *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RuleConcatLeftShift::RuleConcatLeftShift((RuleConcatLeftShift *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RuleEmbed::RuleEmbed((RuleEmbed *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RuleSubZext::RuleSubZext((RuleSubZext *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RuleSubCancel::RuleSubCancel((RuleSubCancel *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RuleShiftSub::RuleShiftSub((RuleShiftSub *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RuleHumptyDumpty::RuleHumptyDumpty((RuleHumptyDumpty *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RuleDumptyHump::RuleDumptyHump((RuleDumptyHump *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RuleHumptyOr::RuleHumptyOr((RuleHumptyOr *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RuleNegateIdentity::RuleNegateIdentity((RuleNegateIdentity *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RuleSubNormal::RuleSubNormal((RuleSubNormal *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RulePositiveDiv::RulePositiveDiv((RulePositiveDiv *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RuleDivTermAdd::RuleDivTermAdd((RuleDivTermAdd *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RuleDivTermAdd2::RuleDivTermAdd2((RuleDivTermAdd2 *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RuleDivOpt::RuleDivOpt((RuleDivOpt *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RuleSignForm::RuleSignForm((RuleSignForm *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RuleSignDiv2::RuleSignDiv2((RuleSignDiv2 *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RuleSignNearMult::RuleSignNearMult((RuleSignNearMult *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RuleModOpt::RuleModOpt((RuleModOpt *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RuleSwitchSingle::RuleSwitchSingle((RuleSwitchSingle *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RuleCondNegate::RuleCondNegate((RuleCondNegate *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RuleBoolNegate::RuleBoolNegate((RuleBoolNegate *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RuleLessEqual::RuleLessEqual((RuleLessEqual *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RuleLessNotEqual::RuleLessNotEqual((RuleLessNotEqual *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RuleLessOne::RuleLessOne((RuleLessOne *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RuleRangeMeld::RuleRangeMeld((RuleRangeMeld *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RuleFloatRange::RuleFloatRange((RuleFloatRange *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RulePiece2Zext::RulePiece2Zext((RulePiece2Zext *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RulePiece2Sext::RulePiece2Sext((RulePiece2Sext *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"subvar","");
  RuleSubvarAnd::RuleSubvarAnd((RuleSubvarAnd *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"subvar","");
  RuleSubvarSubpiece::RuleSubvarSubpiece((RuleSubvarSubpiece *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"subvar","");
  RuleSplitFlow::RuleSplitFlow((RuleSplitFlow *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  this_05 = (RulePtrFlow *)operator_new(0x68);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"subvar","");
  RulePtrFlow::RulePtrFlow(this_05,&local_68,local_48);
  ActionPool::addRule(pAVar8,(Rule *)this_05);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"subvar","");
  RuleSubvarCompZero::RuleSubvarCompZero((RuleSubvarCompZero *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"subvar","");
  RuleSubvarShift::RuleSubvarShift((RuleSubvarShift *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"subvar","");
  RuleSubvarZext::RuleSubvarZext((RuleSubvarZext *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  this_06 = (RuleSubvarSext *)operator_new(0x60);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"subvar","");
  RuleSubvarSext::RuleSubvarSext(this_06,&local_68);
  ActionPool::addRule(pAVar8,(Rule *)this_06);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RuleNegateNegate::RuleNegateNegate((RuleNegateNegate *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"conditionalexe","");
  RuleConditionalMove::RuleConditionalMove((RuleConditionalMove *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"conditionalexe","");
  RuleOrPredicate::RuleOrPredicate((RuleOrPredicate *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  RuleFuncPtrEncoding::RuleFuncPtrEncoding((RuleFuncPtrEncoding *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"floatprecision","");
  RuleSubfloatConvert::RuleSubfloatConvert((RuleSubfloatConvert *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"floatprecision","");
  RuleFloatCast::RuleFloatCast((RuleFloatCast *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"floatprecision","");
  RuleIgnoreNan::RuleIgnoreNan((RuleIgnoreNan *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"typerecovery","");
  RulePtraddUndo::RulePtraddUndo((RulePtraddUndo *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"typerecovery","");
  RulePtrsubUndo::RulePtrsubUndo((RulePtrsubUndo *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"segment","");
  RuleSegment::RuleSegment((RuleSegment *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"doubleload","");
  RuleDoubleLoad::RuleDoubleLoad((RuleDoubleLoad *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"doubleprecis","");
  RuleDoubleIn::RuleDoubleIn((RuleDoubleIn *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pAVar4 = local_48;
  for (ppRVar10 = (local_48->extra_pool_rules).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      ppRVar3 = (pAVar4->extra_pool_rules).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>.
                _M_impl.super__Vector_impl_data._M_finish, ppRVar10 != ppRVar3;
      ppRVar10 = ppRVar10 + 1) {
    ActionPool::addRule(pAVar8,*ppRVar10);
  }
  ppRVar10 = (pAVar4->extra_pool_rules).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (ppRVar3 != ppRVar10) {
    (pAVar4->extra_pool_rules).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppRVar10;
  }
  ActionGroup::addAction(pAVar6,(Action *)pAVar8);
  pAVar5 = (Action *)operator_new(0x68);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  ActionMultiCse::ActionMultiCse((ActionMultiCse *)pAVar5,&local_68);
  pAVar2 = local_38;
  ActionGroup::addAction(pAVar6,pAVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pAVar5 = (Action *)operator_new(0x68);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  ActionShadowVar::ActionShadowVar((ActionShadowVar *)pAVar5,&local_68);
  ActionGroup::addAction(pAVar6,pAVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pAVar5 = (Action *)operator_new(0x68);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"deindirect","");
  ActionDeindirect::ActionDeindirect((ActionDeindirect *)pAVar5,&local_68);
  ActionGroup::addAction(pAVar6,pAVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  this_07 = (ActionStackPtrFlow *)operator_new(0x78);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"stackptrflow","");
  ActionStackPtrFlow::ActionStackPtrFlow(this_07,&local_68,pAVar2);
  ActionGroup::addAction(pAVar6,(Action *)this_07);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  ActionGroup::addAction(this_01,(Action *)pAVar6);
  pAVar5 = (Action *)operator_new(0x68);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"deadcontrolflow","");
  ActionRedundBranch::ActionRedundBranch((ActionRedundBranch *)pAVar5,&local_68);
  ActionGroup::addAction(this_01,pAVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pAVar5 = (Action *)operator_new(0x68);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"blockrecovery","");
  ActionBlockStructure::ActionBlockStructure((ActionBlockStructure *)pAVar5,&local_68);
  ActionGroup::addAction(this_01,pAVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  this_08 = (ActionConstantPtr *)operator_new(0x70);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"typerecovery","");
  ActionConstantPtr::ActionConstantPtr(this_08,&local_68);
  ActionGroup::addAction(this_01,(Action *)this_08);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pAVar8 = (ActionPool *)operator_new(0x768);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"oppool2","");
  ActionPool::ActionPool(pAVar8,4,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"typerecovery","");
  RulePushPtr::RulePushPtr((RulePushPtr *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"typerecovery","");
  RuleStructOffset0::RuleStructOffset0((RuleStructOffset0 *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"typerecovery","");
  RulePtrArith::RulePtrArith((RulePtrArith *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"stackvars","");
  RuleLoadVarnode::RuleLoadVarnode((RuleLoadVarnode *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"stackvars","");
  RuleStoreVarnode::RuleStoreVarnode((RuleStoreVarnode *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  ActionGroup::addAction(this_01,(Action *)pAVar8);
  pAVar5 = (Action *)operator_new(0x68);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"unreachable","");
  ActionDeterminedBranch::ActionDeterminedBranch((ActionDeterminedBranch *)pAVar5,&local_68);
  pAVar6 = local_40;
  ActionGroup::addAction(this_01,pAVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pAVar5 = (Action *)operator_new(0x68);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"unreachable","");
  ActionUnreachable::ActionUnreachable((ActionUnreachable *)pAVar5,&local_68);
  ActionGroup::addAction(this_01,pAVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pAVar5 = (Action *)operator_new(0x68);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"nodejoin","");
  ActionNodeJoin::ActionNodeJoin((ActionNodeJoin *)pAVar5,&local_68);
  ActionGroup::addAction(this_01,pAVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pAVar5 = (Action *)operator_new(0x68);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"conditionalexe","");
  ActionConditionalExe::ActionConditionalExe((ActionConditionalExe *)pAVar5,&local_68);
  ActionGroup::addAction(this_01,pAVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pAVar5 = (Action *)operator_new(0x68);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"analysis","");
  ActionConditionalConst::ActionConditionalConst((ActionConditionalConst *)pAVar5,&local_68);
  ActionGroup::addAction(this_01,pAVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  ActionGroup::addAction(pAVar6,(Action *)this_01);
  pAVar5 = (Action *)operator_new(0x68);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"protorecovery","");
  ActionLikelyTrash::ActionLikelyTrash((ActionLikelyTrash *)pAVar5,&local_68);
  ActionGroup::addAction(pAVar6,pAVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pAVar7 = (ActionDirectWrite *)operator_new(0x70);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"protorecovery_a","");
  ActionDirectWrite::ActionDirectWrite(pAVar7,&local_68,true);
  ActionGroup::addAction(pAVar6,(Action *)pAVar7);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pAVar7 = (ActionDirectWrite *)operator_new(0x70);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"protorecovery_b","");
  ActionDirectWrite::ActionDirectWrite(pAVar7,&local_68,false);
  ActionGroup::addAction(pAVar6,(Action *)pAVar7);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pAVar5 = (Action *)operator_new(0x68);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"deadcode","");
  ActionDeadCode::ActionDeadCode((ActionDeadCode *)pAVar5,&local_68);
  ActionGroup::addAction(pAVar6,pAVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pAVar5 = (Action *)operator_new(0x68);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"deadcontrolflow","");
  ActionDoNothing::ActionDoNothing((ActionDoNothing *)pAVar5,&local_68);
  ActionGroup::addAction(pAVar6,pAVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pAVar5 = (Action *)operator_new(0x68);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"switchnorm","");
  ActionSwitchNorm::ActionSwitchNorm((ActionSwitchNorm *)pAVar5,&local_68);
  ActionGroup::addAction(pAVar6,pAVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pAVar5 = (Action *)operator_new(0x68);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"returnsplit","");
  ActionReturnSplit::ActionReturnSplit((ActionReturnSplit *)pAVar5,&local_68);
  ActionGroup::addAction(pAVar6,pAVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pAVar5 = (Action *)operator_new(0x68);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"protorecovery","");
  ActionUnjustifiedParams::ActionUnjustifiedParams((ActionUnjustifiedParams *)pAVar5,&local_68);
  ActionGroup::addAction(pAVar6,pAVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pAVar5 = (Action *)operator_new(0x68);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"typerecovery","");
  ActionStartTypes::ActionStartTypes((ActionStartTypes *)pAVar5,&local_68);
  ActionGroup::addAction(pAVar6,pAVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pAVar5 = (Action *)operator_new(0x68);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"protorecovery","");
  ActionActiveReturn::ActionActiveReturn((ActionActiveReturn *)pAVar5,&local_68);
  ActionGroup::addAction(pAVar6,pAVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  ActionGroup::addAction(this,&pAVar6->super_Action);
  pAVar5 = (Action *)operator_new(0x68);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"cleanup","");
  ActionStartCleanUp::ActionStartCleanUp((ActionStartCleanUp *)pAVar5,&local_68);
  ActionGroup::addAction(this,pAVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pAVar8 = (ActionPool *)operator_new(0x768);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"cleanup","");
  ActionPool::ActionPool(pAVar8,4,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"cleanup","");
  RuleMultNegOne::RuleMultNegOne((RuleMultNegOne *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"cleanup","");
  RuleAddUnsigned::RuleAddUnsigned((RuleAddUnsigned *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"cleanup","");
  Rule2Comp2Sub::Rule2Comp2Sub((Rule2Comp2Sub *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"cleanup","");
  RuleSubRight::RuleSubRight((RuleSubRight *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar9 = (Rule *)operator_new(0x58);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"cleanup","");
  RulePtrsubCharConstant::RulePtrsubCharConstant((RulePtrsubCharConstant *)pRVar9,&local_68);
  ActionPool::addRule(pAVar8,pRVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  ActionGroup::addAction(this,(Action *)pAVar8);
  pAVar5 = (Action *)operator_new(0x68);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"blockrecovery","");
  ActionPreferComplement::ActionPreferComplement((ActionPreferComplement *)pAVar5,&local_68);
  ActionGroup::addAction(this,pAVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pAVar5 = (Action *)operator_new(0x68);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"normalizebranches","");
  ActionNormalizeBranches::ActionNormalizeBranches((ActionNormalizeBranches *)pAVar5,&local_68);
  ActionGroup::addAction(this,pAVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pAVar5 = (Action *)operator_new(0x68);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"merge","");
  ActionAssignHigh::ActionAssignHigh((ActionAssignHigh *)pAVar5,&local_68);
  ActionGroup::addAction(this,pAVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pAVar5 = (Action *)operator_new(0x68);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"merge","");
  ActionMergeRequired::ActionMergeRequired((ActionMergeRequired *)pAVar5,&local_68);
  ActionGroup::addAction(this,pAVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pAVar5 = (Action *)operator_new(0x68);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"merge","");
  ActionMarkExplicit::ActionMarkExplicit((ActionMarkExplicit *)pAVar5,&local_68);
  ActionGroup::addAction(this,pAVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pAVar5 = (Action *)operator_new(0x68);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"merge","");
  ActionMarkImplied::ActionMarkImplied((ActionMarkImplied *)pAVar5,&local_68);
  ActionGroup::addAction(this,pAVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pAVar5 = (Action *)operator_new(0x68);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"merge","");
  ActionMergeCopy::ActionMergeCopy((ActionMergeCopy *)pAVar5,&local_68);
  ActionGroup::addAction(this,pAVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pAVar5 = (Action *)operator_new(0x68);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"merge","");
  ActionDominantCopy::ActionDominantCopy((ActionDominantCopy *)pAVar5,&local_68);
  ActionGroup::addAction(this,pAVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pAVar5 = (Action *)operator_new(0x68);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"merge","");
  ActionMarkIndirectOnly::ActionMarkIndirectOnly((ActionMarkIndirectOnly *)pAVar5,&local_68);
  ActionGroup::addAction(this,pAVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pAVar5 = (Action *)operator_new(0x68);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"merge","");
  ActionMergeAdjacent::ActionMergeAdjacent((ActionMergeAdjacent *)pAVar5,&local_68);
  ActionGroup::addAction(this,pAVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pAVar5 = (Action *)operator_new(0x68);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"merge","");
  ActionMergeType::ActionMergeType((ActionMergeType *)pAVar5,&local_68);
  ActionGroup::addAction(this,pAVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pAVar5 = (Action *)operator_new(0x68);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"merge","");
  ActionHideShadow::ActionHideShadow((ActionHideShadow *)pAVar5,&local_68);
  ActionGroup::addAction(this,pAVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pAVar5 = (Action *)operator_new(0x68);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"merge","");
  ActionCopyMarker::ActionCopyMarker((ActionCopyMarker *)pAVar5,&local_68);
  ActionGroup::addAction(this,pAVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pAVar5 = (Action *)operator_new(0x68);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"localrecovery","");
  ActionOutputPrototype::ActionOutputPrototype((ActionOutputPrototype *)pAVar5,&local_68);
  ActionGroup::addAction(this,pAVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pAVar5 = (Action *)operator_new(0x68);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"fixateproto","");
  ActionInputPrototype::ActionInputPrototype((ActionInputPrototype *)pAVar5,&local_68);
  ActionGroup::addAction(this,pAVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pAVar5 = (Action *)operator_new(0x68);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"localrecovery","");
  ActionRestructureHigh::ActionRestructureHigh((ActionRestructureHigh *)pAVar5,&local_68);
  ActionGroup::addAction(this,pAVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pAVar5 = (Action *)operator_new(0x68);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"fixateglobals","");
  ActionMapGlobals::ActionMapGlobals((ActionMapGlobals *)pAVar5,&local_68);
  ActionGroup::addAction(this,pAVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pAVar5 = (Action *)operator_new(0x68);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"dynamic","");
  ActionDynamicSymbols::ActionDynamicSymbols((ActionDynamicSymbols *)pAVar5,&local_68);
  ActionGroup::addAction(this,pAVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pAVar5 = (Action *)operator_new(0x68);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"merge","");
  ActionNameVars::ActionNameVars((ActionNameVars *)pAVar5,&local_68);
  ActionGroup::addAction(this,pAVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pAVar5 = (Action *)operator_new(0x68);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"casts","");
  ActionSetCasts::ActionSetCasts((ActionSetCasts *)pAVar5,&local_68);
  ActionGroup::addAction(this,pAVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pAVar5 = (Action *)operator_new(0x68);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"blockrecovery","");
  ActionFinalStructure::ActionFinalStructure((ActionFinalStructure *)pAVar5,&local_68);
  ActionGroup::addAction(this,pAVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pAVar5 = (Action *)operator_new(0x68);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"protorecovery","");
  ActionPrototypeWarnings::ActionPrototypeWarnings((ActionPrototypeWarnings *)pAVar5,&local_68);
  ActionGroup::addAction(this,pAVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pAVar5 = (Action *)operator_new(0x68);
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"base","");
  ActionStop::ActionStop((ActionStop *)pAVar5,&local_68);
  ActionGroup::addAction(this,pAVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  return;
}

Assistant:

void universal_action(Architecture *conf)

{
  vector<Rule *>::iterator iter;
  ActionGroup *act;
  ActionGroup *actmainloop;
  ActionGroup *actfullloop;
  ActionPool *actprop,*actprop2;
  ActionPool *actcleanup;
  ActionGroup *actstackstall;
  AddrSpace *stackspace = conf->getStackSpace();

  build_defaultactions(conf->allacts);
  act = new ActionRestartGroup(Action::rule_onceperfunc,"universal",1);
  conf->allacts.registerUniversal(act);

  act->addAction( new ActionStart("base"));
  act->addAction( new ActionConstbase("base"));
  act->addAction( new ActionNormalizeSetup("normalanalysis"));
  act->addAction( new ActionDefaultParams("base"));
  //  act->addAction( new ActionParamShiftStart("paramshift") );
  act->addAction( new ActionExtraPopSetup("base",stackspace) );
  act->addAction( new ActionPrototypeTypes("protorecovery"));
  act->addAction( new ActionFuncLink("protorecovery") );
  act->addAction( new ActionFuncLinkOutOnly("noproto") );
  {
    actfullloop = new ActionGroup(Action::rule_repeatapply,"fullloop");
    {
      actmainloop = new ActionGroup(Action::rule_repeatapply,"mainloop");
      actmainloop->addAction( new ActionUnreachable("base") );
      actmainloop->addAction( new ActionVarnodeProps("base") );
      actmainloop->addAction( new ActionHeritage("base") );
      actmainloop->addAction( new ActionParamDouble("protorecovery") );
      actmainloop->addAction( new ActionSegmentize("base"));
      actmainloop->addAction( new ActionForceGoto("blockrecovery") );
      actmainloop->addAction( new ActionDirectWrite("protorecovery_a", true) );
      actmainloop->addAction( new ActionDirectWrite("protorecovery_b", false) );
      actmainloop->addAction( new ActionActiveParam("protorecovery") );
      actmainloop->addAction( new ActionReturnRecovery("protorecovery") );
      //      actmainloop->addAction( new ActionParamShiftStop("paramshift") );
      actmainloop->addAction( new ActionRestrictLocal("localrecovery") ); // Do before dead code removed
      actmainloop->addAction( new ActionDeadCode("deadcode") );
      actmainloop->addAction( new ActionDynamicMapping("dynamic") ); // Must come before restructurevarnode and infertypes
      actmainloop->addAction( new ActionRestructureVarnode("localrecovery") );
      actmainloop->addAction( new ActionSpacebase("base") );	// Must come before infertypes and nonzeromask
      actmainloop->addAction( new ActionNonzeroMask("analysis") );
      actmainloop->addAction( new ActionInferTypes("typerecovery") );
      actstackstall = new ActionGroup(Action::rule_repeatapply,"stackstall");
      {
	actprop = new ActionPool(Action::rule_repeatapply,"oppool1");
	actprop->addRule( new RuleEarlyRemoval("deadcode"));
	actprop->addRule( new RuleTermOrder("analysis"));
	actprop->addRule( new RuleSelectCse("analysis"));
	actprop->addRule( new RuleCollectTerms("analysis"));
	actprop->addRule( new RulePullsubMulti("analysis"));
	actprop->addRule( new RulePullsubIndirect("analysis"));
	actprop->addRule( new RulePushMulti("nodejoin"));
	actprop->addRule( new RuleSborrow("analysis") );
	actprop->addRule( new RuleIntLessEqual("analysis") );
	actprop->addRule( new RuleTrivialArith("analysis") );
	actprop->addRule( new RuleTrivialBool("analysis") );
	actprop->addRule( new RuleTrivialShift("analysis") );
	actprop->addRule( new RuleSignShift("analysis") );
	actprop->addRule( new RuleTestSign("analysis") );
	actprop->addRule( new RuleIdentityEl("analysis") );
	actprop->addRule( new RuleOrMask("analysis") );
	actprop->addRule( new RuleAndMask("analysis") );
	actprop->addRule( new RuleOrConsume("analysis") );
	actprop->addRule( new RuleOrCollapse("analysis") );
	actprop->addRule( new RuleAndOrLump("analysis") );
	actprop->addRule( new RuleShiftBitops("analysis") );
	actprop->addRule( new RuleRightShiftAnd("analysis") );
	actprop->addRule( new RuleNotDistribute("analysis") );
	actprop->addRule( new RuleHighOrderAnd("analysis") );
	actprop->addRule( new RuleAndDistribute("analysis") );
	actprop->addRule( new RuleAndCommute("analysis") );
	actprop->addRule( new RuleAndPiece("analysis") );
	actprop->addRule( new RuleAndCompare("analysis") );
	actprop->addRule( new RuleDoubleSub("analysis") );
	actprop->addRule( new RuleDoubleShift("analysis") );
	actprop->addRule( new RuleDoubleArithShift("analysis") );
	actprop->addRule( new RuleConcatShift("analysis") );
	actprop->addRule( new RuleLeftRight("analysis") );
	actprop->addRule( new RuleShiftCompare("analysis") );
	actprop->addRule( new RuleShift2Mult("analysis") );
	actprop->addRule( new RuleShiftPiece("analysis") );
	actprop->addRule( new RuleMultiCollapse("analysis") );
	actprop->addRule( new RuleIndirectCollapse("analysis") );
	actprop->addRule( new Rule2Comp2Mult("analysis") );
	actprop->addRule( new RuleSub2Add("analysis") );
	actprop->addRule( new RuleCarryElim("analysis") );
	actprop->addRule( new RuleBxor2NotEqual("analysis") );
	actprop->addRule( new RuleLess2Zero("analysis") );
	actprop->addRule( new RuleLessEqual2Zero("analysis") );
	actprop->addRule( new RuleSLess2Zero("analysis") );
	actprop->addRule( new RuleEqual2Zero("analysis") );
	actprop->addRule( new RuleEqual2Constant("analysis") );
	actprop->addRule( new RuleThreeWayCompare("analysis") );
	actprop->addRule( new RuleXorCollapse("analysis") );
	actprop->addRule( new RuleAddMultCollapse("analysis") );
	actprop->addRule( new RuleCollapseConstants("analysis") );
	actprop->addRule( new RuleTransformCpool("analysis") );
	actprop->addRule( new RulePropagateCopy("analysis") );
	actprop->addRule( new RuleZextEliminate("analysis") );
	actprop->addRule( new RuleSlessToLess("analysis") );
	actprop->addRule( new RuleZextSless("analysis") );
	actprop->addRule( new RuleBitUndistribute("analysis") );
	actprop->addRule( new RuleBoolZext("analysis") );
	actprop->addRule( new RuleBooleanNegate("analysis") );
	actprop->addRule( new RuleLogic2Bool("analysis") );
	actprop->addRule( new RuleSubExtComm("analysis") );
	actprop->addRule( new RuleSubCommute("analysis") );
	actprop->addRule( new RuleConcatCommute("analysis") );
	actprop->addRule( new RuleConcatZext("analysis") );
	actprop->addRule( new RuleZextCommute("analysis") );
	actprop->addRule( new RuleZextShiftZext("analysis") );
	actprop->addRule( new RuleShiftAnd("analysis") );
	actprop->addRule( new RuleConcatZero("analysis") );
	actprop->addRule( new RuleConcatLeftShift("analysis") );
	actprop->addRule( new RuleEmbed("analysis") );
	actprop->addRule( new RuleSubZext("analysis") );
	actprop->addRule( new RuleSubCancel("analysis") );
	actprop->addRule( new RuleShiftSub("analysis") );
	actprop->addRule( new RuleHumptyDumpty("analysis") );
	actprop->addRule( new RuleDumptyHump("analysis") );
	actprop->addRule( new RuleHumptyOr("analysis") );
	actprop->addRule( new RuleNegateIdentity("analysis") );
	actprop->addRule( new RuleSubNormal("analysis") );
	actprop->addRule( new RulePositiveDiv("analysis") );
	actprop->addRule( new RuleDivTermAdd("analysis") );
	actprop->addRule( new RuleDivTermAdd2("analysis") );
	actprop->addRule( new RuleDivOpt("analysis") );
	actprop->addRule( new RuleSignForm("analysis") );
	actprop->addRule( new RuleSignDiv2("analysis") );
	actprop->addRule( new RuleSignNearMult("analysis") );
	actprop->addRule( new RuleModOpt("analysis") );
	actprop->addRule( new RuleSwitchSingle("analysis") );
	actprop->addRule( new RuleCondNegate("analysis") );
	actprop->addRule( new RuleBoolNegate("analysis") );
	actprop->addRule( new RuleLessEqual("analysis") );
	actprop->addRule( new RuleLessNotEqual("analysis") );
	actprop->addRule( new RuleLessOne("analysis") );
	actprop->addRule( new RuleRangeMeld("analysis") );
	actprop->addRule( new RuleFloatRange("analysis") );
	actprop->addRule( new RulePiece2Zext("analysis") );
	actprop->addRule( new RulePiece2Sext("analysis") );
	actprop->addRule( new RuleSubvarAnd("subvar") );
	actprop->addRule( new RuleSubvarSubpiece("subvar") );
	actprop->addRule( new RuleSplitFlow("subvar") );
	actprop->addRule( new RulePtrFlow("subvar",conf) );
	actprop->addRule( new RuleSubvarCompZero("subvar") );
	actprop->addRule( new RuleSubvarShift("subvar") );
	actprop->addRule( new RuleSubvarZext("subvar") );
	actprop->addRule( new RuleSubvarSext("subvar") );
	actprop->addRule( new RuleNegateNegate("analysis") );
	actprop->addRule( new RuleConditionalMove("conditionalexe") );
	actprop->addRule( new RuleOrPredicate("conditionalexe") );
	actprop->addRule( new RuleFuncPtrEncoding("analysis") );
	actprop->addRule( new RuleSubfloatConvert("floatprecision") );
	actprop->addRule( new RuleFloatCast("floatprecision") );
	actprop->addRule( new RuleIgnoreNan("floatprecision") );
	actprop->addRule( new RulePtraddUndo("typerecovery") );
	actprop->addRule( new RulePtrsubUndo("typerecovery") );
	actprop->addRule( new RuleSegment("segment") );

	actprop->addRule( new RuleDoubleLoad("doubleload") );
	actprop->addRule( new RuleDoubleIn("doubleprecis") );
	for(iter=conf->extra_pool_rules.begin();iter!=conf->extra_pool_rules.end();++iter)
	  actprop->addRule( *iter ); // Add CPU specific rules
	conf->extra_pool_rules.clear(); // Rules are now absorbed into universal
      }
      actstackstall->addAction( actprop );
      actstackstall->addAction( new ActionMultiCse("analysis") );
      actstackstall->addAction( new ActionShadowVar("analysis") );
      actstackstall->addAction( new ActionDeindirect("deindirect") );
      actstackstall->addAction( new ActionStackPtrFlow("stackptrflow",stackspace));
      actmainloop->addAction( actstackstall );
      actmainloop->addAction( new ActionRedundBranch("deadcontrolflow") ); // dead code removal
      actmainloop->addAction( new ActionBlockStructure("blockrecovery"));
      actmainloop->addAction( new ActionConstantPtr("typerecovery") );
      {
	actprop2 = new ActionPool(Action::rule_repeatapply,"oppool2");

	actprop2->addRule( new RulePushPtr("typerecovery") );
	actprop2->addRule( new RuleStructOffset0("typerecovery") );
	actprop2->addRule( new RulePtrArith("typerecovery") );
	//	actprop2->addRule( new RuleIndirectConcat("analysis") );
	actprop2->addRule( new RuleLoadVarnode("stackvars") );
	actprop2->addRule( new RuleStoreVarnode("stackvars") );
      }
      actmainloop->addAction( actprop2 );
      actmainloop->addAction( new ActionDeterminedBranch("unreachable") );
      actmainloop->addAction( new ActionUnreachable("unreachable") );
      actmainloop->addAction( new ActionNodeJoin("nodejoin") );
      actmainloop->addAction( new ActionConditionalExe("conditionalexe") );
      actmainloop->addAction( new ActionConditionalConst("analysis") );
    }
    actfullloop->addAction( actmainloop );
    actfullloop->addAction( new ActionLikelyTrash("protorecovery") );
    actfullloop->addAction( new ActionDirectWrite("protorecovery_a", true) );
    actfullloop->addAction( new ActionDirectWrite("protorecovery_b", false) );
    actfullloop->addAction( new ActionDeadCode("deadcode") );
    actfullloop->addAction( new ActionDoNothing("deadcontrolflow") );
    actfullloop->addAction( new ActionSwitchNorm("switchnorm") );
    actfullloop->addAction( new ActionReturnSplit("returnsplit") );
    actfullloop->addAction( new ActionUnjustifiedParams("protorecovery") );
    actfullloop->addAction( new ActionStartTypes("typerecovery") );
    actfullloop->addAction( new ActionActiveReturn("protorecovery") );
  }
  act->addAction( actfullloop );
  act->addAction( new ActionStartCleanUp("cleanup") );
  {
    actcleanup = new ActionPool(Action::rule_repeatapply,"cleanup");

    actcleanup->addRule( new RuleMultNegOne("cleanup") );
    actcleanup->addRule( new RuleAddUnsigned("cleanup") );
    actcleanup->addRule( new Rule2Comp2Sub("cleanup") );
    actcleanup->addRule( new RuleSubRight("cleanup") );
    actcleanup->addRule( new RulePtrsubCharConstant("cleanup") );
  }
  act->addAction( actcleanup );

  act->addAction( new ActionPreferComplement("blockrecovery") );
  act->addAction( new ActionNormalizeBranches("normalizebranches") );
  act->addAction( new ActionAssignHigh("merge") );
  act->addAction( new ActionMergeRequired("merge") );
  act->addAction( new ActionMarkExplicit("merge") );
  act->addAction( new ActionMarkImplied("merge") ); // This must come BEFORE general merging
  act->addAction( new ActionMergeCopy("merge") );
  act->addAction( new ActionDominantCopy("merge") );
  act->addAction( new ActionMarkIndirectOnly("merge") ); // Must come after required merges but before speculative
  act->addAction( new ActionMergeAdjacent("merge") );
  act->addAction( new ActionMergeType("merge") );
  act->addAction( new ActionHideShadow("merge") );
  act->addAction( new ActionCopyMarker("merge") );
  act->addAction( new ActionOutputPrototype("localrecovery") );
  act->addAction( new ActionInputPrototype("fixateproto") );
  act->addAction( new ActionRestructureHigh("localrecovery") );
  act->addAction( new ActionMapGlobals("fixateglobals") );
  act->addAction( new ActionDynamicSymbols("dynamic") );
  act->addAction( new ActionNameVars("merge") );
  act->addAction( new ActionSetCasts("casts") );
  act->addAction( new ActionFinalStructure("blockrecovery") );
  act->addAction( new ActionPrototypeWarnings("protorecovery") );
  act->addAction( new ActionStop("base") );
}